

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

void __thiscall soplex::SPxDevexPR<double>::entered4(SPxDevexPR<double> *this,SPxId param_2,int n)

{
  int iVar1;
  UpdateVector<double> *pUVar2;
  double *pdVar3;
  IdxSet *this_00;
  SPxDevexPR<double> *this_01;
  IdxSet *this_02;
  char *pcVar4;
  double *pdVar5;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  long in_RDI;
  double dVar6;
  double dVar7;
  int j;
  int i;
  double xi_p;
  IdxSet *coPidx;
  double *coPvec;
  IdxSet *pIdx;
  double *pVec;
  VectorBase<double> *coWeights;
  VectorBase<double> *weights;
  undefined8 in_stack_ffffffffffffff88;
  SSVectorBase<double> *in_stack_ffffffffffffff90;
  uint local_58;
  Type tp;
  
  if (in_EDX < 0) {
    return;
  }
  iVar1 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2dfbdc);
  if (iVar1 <= in_EDX) {
    return;
  }
  pUVar2 = SPxSolverBase<double>::pVec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  UpdateVector<double>::delta(pUVar2);
  pdVar3 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2dfc08);
  SPxSolverBase<double>::pVec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  this_00 = UpdateVector<double>::idx((UpdateVector<double> *)0x2dfc26);
  pUVar2 = SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  UpdateVector<double>::delta(pUVar2);
  this_01 = (SPxDevexPR<double> *)SSVectorBase<double>::values((SSVectorBase<double> *)0x2dfc4c);
  SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  this_02 = UpdateVector<double>::idx((UpdateVector<double> *)0x2dfc6a);
  pUVar2 = SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  UpdateVector<double>::delta(pUVar2);
  dVar6 = SSVectorBase<double>::operator[]
                    (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  dVar6 = (1.0 / dVar6) * (1.0 / dVar6) * *(double *)(in_RDI + 0x38);
  local_58 = IdxSet::size(this_02);
  iVar1 = extraout_EDX;
  while (local_58 = local_58 - 1, -1 < (int)local_58) {
    pcVar4 = IdxSet::index(this_02,(char *)(ulong)local_58,iVar1);
    in_stack_ffffffffffffff90 =
         (SSVectorBase<double> *)
         (dVar6 * (double)(&(this_01->super_SPxPricer<double>)._vptr_SPxPricer)[(int)pcVar4] *
         (double)(&(this_01->super_SPxPricer<double>)._vptr_SPxPricer)[(int)pcVar4]);
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,
                        (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    *pdVar5 = (double)in_stack_ffffffffffffff90 + *pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,
                        (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if ((*pdVar5 <= 1.0) ||
       (pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff90,
                            (int)((ulong)in_stack_ffffffffffffff88 >> 0x20)),
       iVar1 = extraout_EDX_00, 1000000.0 < *pdVar5)) {
      setupWeights(this_01,(Type)((ulong)this_02 >> 0x20));
      return;
    }
  }
  local_58 = IdxSet::size(this_00);
  iVar1 = extraout_EDX_01;
  do {
    local_58 = local_58 - 1;
    if ((int)local_58 < 0) {
      return;
    }
    pcVar4 = IdxSet::index(this_00,(char *)(ulong)local_58,iVar1);
    dVar7 = dVar6 * pdVar3[(int)pcVar4] * pdVar3[(int)pcVar4];
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,(int)((ulong)dVar7 >> 0x20))
    ;
    *pdVar5 = dVar7 + *pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,(int)((ulong)dVar7 >> 0x20))
    ;
    tp = (Type)((ulong)this_02 >> 0x20);
    if (*pdVar5 <= 1.0) break;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffff90,(int)((ulong)dVar7 >> 0x20))
    ;
    tp = (Type)((ulong)this_02 >> 0x20);
    iVar1 = extraout_EDX_02;
  } while (*pdVar5 <= 1000000.0);
  setupWeights(this_01,tp);
  return;
}

Assistant:

void SPxDevexPR<R>::entered4(SPxId /*id*/, int n)
{
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(n >= 0 && n < this->thesolver->dim())
   {
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      xi_p = xi_p * xi_p * last;

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         coWeights[i] += xi_p * coPvec[i] * coPvec[i];

         if(coWeights[i] <= 1 || coWeights[i] > 1e+6)
         {
            setupWeights(SPxSolverBase<R>::ENTER);
            return;
         }
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         weights[i] += xi_p * pVec[i] * pVec[i];

         if(weights[i] <= 1 || weights[i] > 1e+6)
         {
            setupWeights(SPxSolverBase<R>::ENTER);
            return;
         }
      }
   }
}